

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTransaction::SetUnlockingScript
          (AbstractTransaction *this,uint32_t tx_in_index,Script *unlocking_script)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *tx;
  bool bVar1;
  CfdException *pCVar2;
  ulong index;
  uchar *script;
  size_type script_len;
  allocator local_f1;
  string local_f0;
  CfdSourceLocation local_d0;
  int local_b4;
  undefined1 local_b0 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *arrays;
  wally_tx *tx_pointer;
  allocator local_59;
  string local_58;
  CfdSourceLocation local_38;
  Script *local_20;
  Script *unlocking_script_local;
  AbstractTransaction *pAStack_10;
  uint32_t tx_in_index_local;
  AbstractTransaction *this_local;
  
  local_20 = unlocking_script;
  unlocking_script_local._4_4_ = tx_in_index;
  pAStack_10 = this;
  (*this->_vptr_AbstractTransaction[0xb])(this,(ulong)tx_in_index,399,"SetUnlockingScript");
  bVar1 = Script::IsPushOnly(local_20);
  if (!bVar1) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x191;
    local_38.funcname = "SetUnlockingScript";
    logger::warn<>(&local_38,"IsPushOnly() false.");
    tx_pointer._3_1_ = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_58,
               "unlocking script error. The script needs to be push operator only.",&local_59);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_58);
    tx_pointer._3_1_ = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  arrays = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this->wally_tx_pointer_;
  Script::GetData((ByteData *)local_b0,local_20);
  ByteData::GetBytes(&local_98,(ByteData *)local_b0);
  ByteData::~ByteData((ByteData *)local_b0);
  tx = arrays;
  local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98;
  index = (ulong)unlocking_script_local._4_4_;
  script = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_80);
  script_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_80);
  local_b4 = wally_tx_set_input_script((wally_tx *)tx,index,script,script_len);
  if (local_b4 != 0) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x19e;
    local_d0.funcname = "SetUnlockingScript";
    logger::warn<int&>(&local_d0,"wally_tx_set_input_script NG[{}].",&local_b4);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f0,"unlocking script setting error.",&local_f1);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_f0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
  return;
}

Assistant:

void AbstractTransaction::SetUnlockingScript(
    uint32_t tx_in_index, const Script &unlocking_script) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);
  if (!unlocking_script.IsPushOnly()) {
    warn(CFD_LOG_SOURCE, "IsPushOnly() false.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "unlocking script error. "
        "The script needs to be push operator only.");
  }

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &arrays = unlocking_script.GetData().GetBytes();
  int ret = wally_tx_set_input_script(
      tx_pointer, tx_in_index, arrays.data(), arrays.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_set_input_script NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "unlocking script setting error.");
  }
}